

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O1

int __thiscall
CNetBan::Unban<CNetBan::CBanPool<CNetRange,16>>
          (CNetBan *this,CBanPool<CNetRange,_16> *pBanPool,CDataType *pData)

{
  long lVar1;
  byte bVar2;
  CBan<CNetRange> *pBan;
  long lVar3;
  long lVar4;
  int iVar5;
  long in_FS_OFFSET;
  char aBuf [256];
  CNetHash local_140;
  char local_138 [264];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_140.m_Hash = 0;
  local_140.m_HashIndex = 0;
  bVar2 = (pData->m_LB).ip[0];
  if (bVar2 == (pData->m_UB).ip[0]) {
    local_140.m_Hash = 0;
    lVar3 = 0;
    do {
      local_140.m_Hash = local_140.m_Hash + (uint)bVar2;
      bVar2 = (pData->m_LB).ip[lVar3 + 1];
      lVar4 = lVar3 + 1;
      lVar1 = lVar3 + 1;
      lVar3 = lVar4;
    } while (bVar2 == (pData->m_UB).ip[lVar1]);
    local_140.m_HashIndex = (int)lVar4;
  }
  local_140.m_Hash = (uint)(byte)local_140.m_Hash;
  pBan = CBanPool<CNetRange,_16>::Find(pBanPool,pData,&local_140);
  if (pBan == (CBan<CNetRange> *)0x0) {
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"net_ban","unban failed (invalid entry)",0);
    iVar5 = -1;
  }
  else {
    iVar5 = 0;
    MakeBanInfo<CNetRange>(this,pBan,local_138,0x100,3,(int *)0x0);
    CBanPool<CNetRange,_16>::Remove(pBanPool,pBan);
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"net_ban",local_138,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

int CNetBan::Unban(T *pBanPool, const typename T::CDataType *pData)
{
	CNetHash NetHash(pData);
	CBan<typename T::CDataType> *pBan = pBanPool->Find(pData, &NetHash);
	if(pBan)
	{
		char aBuf[256];
		MakeBanInfo(pBan, aBuf, sizeof(aBuf), MSGTYPE_BANREM);
		pBanPool->Remove(pBan);
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aBuf);
		return 0;
	}
	else
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", "unban failed (invalid entry)");
	return -1;
}